

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

bool DnsStats::GetTLD(uint8_t *packet,uint32_t length,uint32_t start,uint32_t *offset,
                     uint32_t *previous_offset,int *nb_name_parts)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t previous_recursive;
  int nb_parts_recursive;
  uint32_t local_38 [2];
  
  bVar2 = true;
  uVar5 = 0;
  if (start < length) {
    iVar3 = 0;
    uVar7 = start;
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar8 = uVar6;
      uVar6 = uVar7;
      bVar1 = packet[uVar6];
      if (bVar1 == 0) {
        if (iVar3 == 0) {
          *offset = uVar6;
          goto LAB_0015e679;
        }
        *offset = uVar8;
        break;
      }
      uVar4 = (uint)bVar1;
      if ((~uVar4 & 0xc0) == 0) {
        if (length < uVar6 + 2) {
LAB_0015e62b:
          bVar2 = false;
        }
        else {
          uVar4 = (uint)packet[(ulong)uVar6 + 1] | (uVar4 & 0x3f) << 8;
          bVar2 = false;
          if (uVar4 < start) {
            local_38[0] = 0;
            local_38[1] = 0;
            bVar2 = GetTLD(packet,length,uVar4,offset,local_38,(int *)(local_38 + 1));
            if (local_38[0] != 0) {
              uVar8 = local_38[0];
            }
            iVar3 = iVar3 + local_38[1];
            uVar5 = uVar8;
          }
        }
        break;
      }
      if ((0x3f < bVar1) || (uVar7 = uVar4 + uVar6 + 1, length < uVar7)) goto LAB_0015e62b;
      iVar3 = iVar3 + 1;
      uVar5 = uVar8;
    } while (uVar7 < length);
  }
  else {
LAB_0015e679:
    iVar3 = 0;
  }
  if (nb_name_parts != (int *)0x0) {
    *nb_name_parts = iVar3;
  }
  if (previous_offset != (uint32_t *)0x0) {
    *previous_offset = uVar5;
  }
  return bVar2;
}

Assistant:

bool DnsStats::GetTLD(uint8_t * packet, uint32_t length, uint32_t start, uint32_t * offset,
    uint32_t * previous_offset,  int * nb_name_parts)
{
    bool ret = true;
    uint32_t l = 0;
    uint32_t previous_o = 0;
    uint32_t previous = 0;
    uint32_t name_start = start;
    int nb_parts = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/

            if (nb_parts != 0)
            {
                *offset = previous;
            }
            else
            {
                *offset = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if ((start + 2) > length)
            {
                ret = false;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];
                
                if (new_start < name_start)
                {
                    int nb_parts_recursive = 0;
                    uint32_t previous_recursive = 0;

                    ret = GetTLD(packet, length, new_start, offset, &previous_recursive, &nb_parts_recursive);
                    if (previous_recursive != 0) {
                        previous_o = previous_recursive;
                    }
                    else {
                        previous_o = previous;
                    }
                    nb_parts += nb_parts_recursive;
                }
                else
                {
                    ret = false;
                }
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* Unexpected name part */
            ret = false;
            break;
        }
        else
        {
            if (start + l + 1 > length)
            {
                /* malformed name part */
                ret = false;
                break;
            }
            else
            {
                nb_parts++;
                previous_o = previous;
                previous = start;
                start += l + 1;
            }
        }
    }

    if (nb_name_parts != NULL) {
        *nb_name_parts = nb_parts;
    }

    if (previous_offset != NULL) {
        *previous_offset = previous_o;
    }

    return ret;
}